

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

int32 read_classdef_file(hash_table_t *classes,char *file_name)

{
  gnode_s **ppgVar1;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  FILE *__stream;
  char *pcVar5;
  glist_t g;
  glist_t g_00;
  char *__s2;
  classdef_t *classdef;
  char **ppcVar6;
  float32 *pfVar7;
  classdef_t *pcVar8;
  long lVar9;
  gnode_s *pgVar10;
  gnode_s *pgVar11;
  float fVar12;
  double dVar13;
  int32 is_pipe;
  char *wptr [2];
  char line [512];
  int32 local_264;
  char *local_260;
  char *local_258;
  char *local_250;
  hash_table_t *local_240;
  char local_238 [520];
  
  __stream = (FILE *)fopen_comp(file_name,"r",&local_264);
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x394,"File %s not found\n",file_name);
    iVar4 = -1;
  }
  else {
    iVar3 = feof(__stream);
    if (iVar3 == 0) {
      bVar2 = false;
      __s2 = (char *)0x0;
      g_00 = (glist_t)0x0;
      g = (glist_t)0x0;
      local_240 = classes;
      do {
        pcVar5 = fgets(local_238,0x200,__stream);
        if (pcVar5 == (char *)0x0) break;
        iVar4 = str2words(local_238,&local_258,2);
        if (0 < iVar4) {
          if (bVar2) {
            fVar12 = 1.0;
            if (iVar4 == 2) {
              iVar3 = strcmp(local_258,"END");
              if (iVar3 == 0) {
                if ((__s2 != (char *)0x0) && (iVar3 = strcmp(local_250,__s2), iVar3 == 0)) {
                  local_260 = __s2;
                  classdef = (classdef_t *)
                             __ckd_calloc__(1,0x18,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                            ,0x3b1);
                  g = glist_reverse(g);
                  g_00 = glist_reverse(g_00);
                  iVar4 = glist_count(g);
                  classdef->n_words = iVar4;
                  ppcVar6 = (char **)__ckd_calloc__((long)iVar4,8,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                                  ,0x3b6);
                  classdef->words = ppcVar6;
                  pfVar7 = (float32 *)
                           __ckd_calloc__((long)classdef->n_words,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                          ,0x3b8);
                  __s2 = local_260;
                  classdef->weights = pfVar7;
                  iVar3 = classdef->n_words;
                  if (0 < (long)iVar3) {
                    lVar9 = 0;
                    pgVar10 = g_00;
                    pgVar11 = g;
                    do {
                      *(anytype_t *)(classdef->words + lVar9) = pgVar11->data;
                      classdef->weights[lVar9] = (float32)(float)(pgVar10->data).fl;
                      pgVar11 = pgVar11->next;
                      pgVar10 = pgVar10->next;
                      lVar9 = lVar9 + 1;
                    } while (iVar3 != lVar9);
                  }
                  pcVar8 = (classdef_t *)hash_table_enter(local_240,local_260,classdef);
                  if (pcVar8 == classdef) {
                    glist_free(g);
                    glist_free(g_00);
                    g = (glist_t)0x0;
                    g_00 = (glist_t)0x0;
                    __s2 = (char *)0x0;
                    bVar2 = false;
                    goto LAB_00132a5b;
                  }
                  classdef_free(classdef);
                }
                iVar4 = -1;
                goto LAB_00132a6d;
              }
              dVar13 = atof_c(local_250);
              fVar12 = (float)dVar13;
            }
            local_260 = (char *)CONCAT44(local_260._4_4_,fVar12);
            pcVar5 = __ckd_salloc__(local_258,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x3d9);
            g = glist_add_ptr(g,pcVar5);
            g_00 = glist_add_float32(g_00,local_260._0_4_);
          }
          else {
            bVar2 = false;
            if ((iVar4 != 2) || (iVar3 = strcmp(local_258,"LMCLASS"), iVar3 != 0))
            goto LAB_00132a5b;
            __s2 = __ckd_salloc__(local_250,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                  ,0x3e3);
          }
          bVar2 = true;
        }
LAB_00132a5b:
        iVar3 = feof(__stream);
      } while (iVar3 == 0);
      iVar4 = 0;
LAB_00132a6d:
      fclose_comp((FILE *)__stream,local_264);
      pgVar11 = g;
      if (g == (glist_t)0x0) {
        g = (glist_t)0x0;
      }
      else {
        do {
          ckd_free((pgVar11->data).ptr);
          ppgVar1 = &pgVar11->next;
          pgVar11 = *ppgVar1;
        } while (*ppgVar1 != (gnode_s *)0x0);
      }
    }
    else {
      fclose_comp((FILE *)__stream,local_264);
      g_00 = (glist_t)0x0;
      g = (glist_t)0x0;
      iVar4 = 0;
      __s2 = (char *)0x0;
    }
    glist_free(g);
    glist_free(g_00);
    ckd_free(__s2);
  }
  return iVar4;
}

Assistant:

int32
read_classdef_file(hash_table_t * classes, const char *file_name)
{
    FILE *fp;
    int32 is_pipe;
    int inclass;  /**< Are we currently reading a list of class words? */
    int32 rv = -1;
    gnode_t *gn;
    glist_t classwords = NULL;
    glist_t classprobs = NULL;
    char *classname = NULL;

    if ((fp = fopen_comp(file_name, "r", &is_pipe)) == NULL) {
        E_ERROR("File %s not found\n", file_name);
        return -1;
    }

    inclass = FALSE;
    while (!feof(fp)) {
        char line[512];
        char *wptr[2];
        int n_words;

        if (fgets(line, sizeof(line), fp) == NULL)
            break;

        n_words = str2words(line, wptr, 2);
        if (n_words <= 0)
            continue;

        if (inclass) {
            /* Look for an end of class marker. */
            if (n_words == 2 && 0 == strcmp(wptr[0], "END")) {
                classdef_t *classdef;
                gnode_t *word, *weight;
                int32 i;

                if (classname == NULL || 0 != strcmp(wptr[1], classname))
                    goto error_out;
                inclass = FALSE;

                /* Construct a class from the list of words collected. */
                classdef = ckd_calloc(1, sizeof(*classdef));
                classwords = glist_reverse(classwords);
                classprobs = glist_reverse(classprobs);
                classdef->n_words = glist_count(classwords);
                classdef->words = ckd_calloc(classdef->n_words,
                                             sizeof(*classdef->words));
                classdef->weights = ckd_calloc(classdef->n_words,
                                               sizeof(*classdef->weights));
                word = classwords;
                weight = classprobs;
                for (i = 0; i < classdef->n_words; ++i) {
                    classdef->words[i] = gnode_ptr(word);
                    classdef->weights[i] = gnode_float32(weight);
                    word = gnode_next(word);
                    weight = gnode_next(weight);
                }

                /* Add this class to the hash table. */
                if (hash_table_enter(classes, classname, classdef) !=
                    classdef) {
                    classdef_free(classdef);
                    goto error_out;
                }

                /* Reset everything. */
                glist_free(classwords);
                glist_free(classprobs);
                classwords = NULL;
                classprobs = NULL;
                classname = NULL;
            }
            else {
                float32 fprob;

                if (n_words == 2)
                    fprob = atof_c(wptr[1]);
                else
                    fprob = 1.0f;
                /* Add it to the list of words for this class. */
                classwords =
                    glist_add_ptr(classwords, ckd_salloc(wptr[0]));
                classprobs = glist_add_float32(classprobs, fprob);
            }
        }
        else {
            /* Start a new LM class if the LMCLASS marker is seen */
            if (n_words == 2 && 0 == strcmp(wptr[0], "LMCLASS")) {
                if (inclass)
                    goto error_out;
                inclass = TRUE;
                classname = ckd_salloc(wptr[1]);
            }
            /* Otherwise, just ignore whatever junk we got */
        }
    }
    rv = 0;                     /* Success. */

  error_out:
    /* Free all the stuff we might have allocated. */
    fclose_comp(fp, is_pipe);
    for (gn = classwords; gn; gn = gnode_next(gn))
        ckd_free(gnode_ptr(gn));
    glist_free(classwords);
    glist_free(classprobs);
    ckd_free(classname);

    return rv;
}